

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winmakefile.cpp
# Opt level: O2

void __thiscall Win32MakefileGenerator::fixTargetExt(Win32MakefileGenerator *this)

{
  QMakeProject *pQVar1;
  long lVar2;
  bool bVar3;
  ProStringList *pPVar4;
  QList<ProString> *pQVar5;
  iterator iVar6;
  QArrayDataPointer<char16_t> *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_468 [2];
  ProString local_438;
  ProKey local_408;
  ProString local_3d8;
  ProKey local_3a8;
  ProString local_378;
  ProKey local_348;
  ProString local_318;
  QStringBuilder<ProString,_ProString> local_2e8;
  QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString> local_288;
  undefined1 local_1f8 [48];
  ProString local_1c8;
  QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>,_char> local_198;
  Data *local_100;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>,_char>,_ProString>
  local_f8;
  
  local_f8.b.m_hash = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_100,"QMAKE_APP_FLAG");
  pPVar4 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_100);
  lVar2 = (pPVar4->super_QList<ProString>).d.size;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_100);
  pQVar1 = (this->super_MakefileGenerator).project;
  if (lVar2 == 0) {
    QString::QString((QString *)&local_100,"shared");
    bVar3 = QMakeProject::isActiveConfig(pQVar1,(QString *)&local_100,false);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_100);
    pQVar1 = (this->super_MakefileGenerator).project;
    if (bVar3) {
      ProKey::ProKey((ProKey *)&local_1c8,"LIB_TARGET");
      pQVar5 = &QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_1c8)->
                super_QList<ProString>;
      pQVar1 = (this->super_MakefileGenerator).project;
      ProKey::ProKey(&local_348,"QMAKE_PREFIX_STATICLIB");
      QMakeEvaluator::first(&local_318,&pQVar1->super_QMakeEvaluator,&local_348);
      pQVar1 = (this->super_MakefileGenerator).project;
      ProKey::ProKey(&local_3a8,"TARGET");
      QMakeEvaluator::first(&local_378,&pQVar1->super_QMakeEvaluator,&local_3a8);
      QStringBuilder<ProString,_ProString>::QStringBuilder(&local_2e8,&local_318,&local_378);
      pQVar1 = (this->super_MakefileGenerator).project;
      ProKey::ProKey(&local_408,"TARGET_VERSION_EXT");
      QMakeEvaluator::first(&local_3d8,&pQVar1->super_QMakeEvaluator,&local_408);
      QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>::QStringBuilder
                (&local_288,&local_2e8,&local_3d8);
      QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>::QStringBuilder
                (&local_198.a,&local_288);
      local_198.b = '.';
      pQVar1 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)local_468,"QMAKE_EXTENSION_STATICLIB");
      QMakeEvaluator::first(&local_438,&pQVar1->super_QMakeEvaluator,(ProKey *)local_468);
      QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>,_char>,_ProString>
      ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>,_char>,_ProString>
                        *)&local_100,&local_198,&local_438);
      ProString::
      ProString<QStringBuilder<QStringBuilder<QStringBuilder<ProString,ProString>,ProString>,char>,ProString>
                ((ProString *)local_1f8,
                 (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>,_char>,_ProString>
                  *)&local_100);
      QList<ProString>::emplaceFront<ProString>(pQVar5,(ProString *)local_1f8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_1f8);
      QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>,_char>,_ProString>
      ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>,_char>,_ProString>
                         *)&local_100);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_438);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(local_468);
      QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>::~QStringBuilder(&local_198.a)
      ;
      QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>::~QStringBuilder(&local_288);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_3d8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_408);
      QStringBuilder<ProString,_ProString>::~QStringBuilder(&local_2e8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_378);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_3a8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_318);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_348);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1c8);
      pQVar1 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)&local_288,"TARGET_EXT");
      pQVar5 = &QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_288)->
                super_QList<ProString>;
      pQVar1 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)local_1f8,"TARGET_VERSION_EXT");
      QMakeEvaluator::first(&local_1c8,&pQVar1->super_QMakeEvaluator,(ProKey *)local_1f8);
      ProString::ProString((ProString *)&local_198,&local_1c8);
      local_198.a.a.b.m_string.d.d = (Data *)0x2252f2;
      pQVar1 = (this->super_MakefileGenerator).project;
      ProKey::ProKey(&local_348,"QMAKE_EXTENSION_SHLIB");
      QMakeEvaluator::first(&local_318,&pQVar1->super_QMakeEvaluator,&local_348);
      QStringBuilder<QStringBuilder<ProString,_const_char_(&)[2]>,_ProString>::QStringBuilder
                ((QStringBuilder<QStringBuilder<ProString,_const_char_(&)[2]>,_ProString> *)
                 &local_100,(QStringBuilder<ProString,_const_char_(&)[2]> *)&local_198,&local_318);
      ProString::ProString<QStringBuilder<ProString,char_const(&)[2]>,ProString>
                (&local_2e8.a,
                 (QStringBuilder<QStringBuilder<ProString,_const_char_(&)[2]>,_ProString> *)
                 &local_100);
      QList<ProString>::emplaceBack<ProString>(pQVar5,&local_2e8.a);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_2e8);
      QStringBuilder<QStringBuilder<ProString,_const_char_(&)[2]>,_ProString>::~QStringBuilder
                ((QStringBuilder<QStringBuilder<ProString,_const_char_(&)[2]>,_ProString> *)
                 &local_100);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_318);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_348);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_198);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_1f8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_288);
      pQVar1 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)&local_288,"QMAKE_PREFIX_SHLIB");
      QMakeEvaluator::first
                ((ProString *)&local_198,&pQVar1->super_QMakeEvaluator,(ProKey *)&local_288);
      pQVar1 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)&local_1c8,"TARGET");
      QMakeEvaluator::first(&local_2e8.a,&pQVar1->super_QMakeEvaluator,(ProKey *)&local_1c8);
      QStringBuilder<ProString,_ProString>::QStringBuilder
                ((QStringBuilder<ProString,_ProString> *)&local_100,(ProString *)&local_198,
                 &local_2e8.a);
      pQVar1 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)local_1f8,"TARGET");
      pQVar5 = &QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)local_1f8)->
                super_QList<ProString>;
      iVar6 = QList<ProString>::begin(pQVar5);
      ProString::operator=(iVar6.i,(QStringBuilder<ProString,_ProString> *)&local_100);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_1f8);
      QStringBuilder<ProString,_ProString>::~QStringBuilder
                ((QStringBuilder<ProString,_ProString> *)&local_100);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_2e8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_198);
      this_00 = (QArrayDataPointer<char16_t> *)&local_288;
    }
    else {
      ProKey::ProKey((ProKey *)&local_198,"TARGET_EXT");
      pQVar5 = &QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_198)->
                super_QList<ProString>;
      pQVar1 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)&local_1c8,"QMAKE_EXTENSION_STATICLIB");
      QMakeEvaluator::first(&local_2e8.a,&pQVar1->super_QMakeEvaluator,(ProKey *)&local_1c8);
      local_100 = (Data *)0x2252f2;
      ProString::ProString((ProString *)&local_f8,&local_2e8.a);
      ProString::ProString<char_const(&)[2],ProString>
                ((ProString *)&local_288,(QStringBuilder<const_char_(&)[2],_ProString> *)&local_100)
      ;
      QList<ProString>::emplaceBack<ProString>(pQVar5,(ProString *)&local_288);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_288);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_2e8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_198);
      pQVar1 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)&local_288,"QMAKE_PREFIX_STATICLIB");
      QMakeEvaluator::first
                ((ProString *)&local_198,&pQVar1->super_QMakeEvaluator,(ProKey *)&local_288);
      pQVar1 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)&local_1c8,"TARGET");
      QMakeEvaluator::first(&local_2e8.a,&pQVar1->super_QMakeEvaluator,(ProKey *)&local_1c8);
      QStringBuilder<ProString,_ProString>::QStringBuilder
                ((QStringBuilder<ProString,_ProString> *)&local_100,(ProString *)&local_198,
                 &local_2e8.a);
      pQVar1 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)local_1f8,"TARGET");
      pQVar5 = &QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)local_1f8)->
                super_QList<ProString>;
      iVar6 = QList<ProString>::begin(pQVar5);
      ProString::operator=(iVar6.i,(QStringBuilder<ProString,_ProString> *)&local_100);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_1f8);
      QStringBuilder<ProString,_ProString>::~QStringBuilder
                ((QStringBuilder<ProString,_ProString> *)&local_100);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_2e8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_198);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_288);
      pQVar1 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)&local_198,"LIB_TARGET");
      pQVar5 = &QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_198)->
                super_QList<ProString>;
      pQVar1 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)&local_1c8,"TARGET");
      QMakeEvaluator::first(&local_2e8.a,&pQVar1->super_QMakeEvaluator,(ProKey *)&local_1c8);
      pQVar1 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)&local_318,"TARGET_EXT");
      QMakeEvaluator::first
                ((ProString *)local_1f8,&pQVar1->super_QMakeEvaluator,(ProKey *)&local_318);
      QStringBuilder<ProString,_ProString>::QStringBuilder
                ((QStringBuilder<ProString,_ProString> *)&local_100,&local_2e8.a,
                 (ProString *)local_1f8);
      ProString::ProString<ProString,ProString>
                ((ProString *)&local_288,(QStringBuilder<ProString,_ProString> *)&local_100);
      QList<ProString>::emplaceFront<ProString>(pQVar5,(ProString *)&local_288);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_288);
      QStringBuilder<ProString,_ProString>::~QStringBuilder
                ((QStringBuilder<ProString,_ProString> *)&local_100);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_1f8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_318);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_2e8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1c8);
      this_00 = (QArrayDataPointer<char16_t> *)&local_198;
    }
  }
  else {
    this_00 = (QArrayDataPointer<char16_t> *)&local_100;
    ProKey::ProKey((ProKey *)this_00,"TARGET_EXT");
    pQVar5 = &QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)this_00)->
              super_QList<ProString>;
    ProString::ProString((ProString *)&local_198,".exe");
    QList<ProString>::emplaceBack<ProString>(pQVar5,(ProString *)&local_198);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_198);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_f8.b.m_hash) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Win32MakefileGenerator::fixTargetExt()
{
    if (!project->values("QMAKE_APP_FLAG").isEmpty()) {
        project->values("TARGET_EXT").append(".exe");
    } else if (project->isActiveConfig("shared")) {
        project->values("LIB_TARGET").prepend(project->first("QMAKE_PREFIX_STATICLIB")
                                              + project->first("TARGET") + project->first("TARGET_VERSION_EXT")
                                              + '.' + project->first("QMAKE_EXTENSION_STATICLIB"));
        project->values("TARGET_EXT").append(project->first("TARGET_VERSION_EXT") + "."
                + project->first("QMAKE_EXTENSION_SHLIB"));
        project->values("TARGET").first() = project->first("QMAKE_PREFIX_SHLIB") + project->first("TARGET");
    } else {
        project->values("TARGET_EXT").append("." + project->first("QMAKE_EXTENSION_STATICLIB"));
        project->values("TARGET").first() = project->first("QMAKE_PREFIX_STATICLIB") + project->first("TARGET");
        project->values("LIB_TARGET").prepend(project->first("TARGET") + project->first("TARGET_EXT"));  // for the .prl only
    }
}